

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O2

void __thiscall
duckdb::Connection::
CreateVectorizedFunction<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
          (Connection *this,string *name,scalar_function_t *udf_func,LogicalType *varargs)

{
  type context;
  LogicalType aLStack_58 [24];
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_40;
  
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (&local_40,udf_func);
  context = shared_ptr<duckdb::ClientContext,_true>::operator*
                      ((shared_ptr<duckdb::ClientContext,_true> *)this);
  duckdb::LogicalType::LogicalType(aLStack_58,varargs);
  UDFWrapper::RegisterFunction<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
            (name,&local_40,context,aLStack_58);
  duckdb::LogicalType::~LogicalType(aLStack_58);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_40);
  return;
}

Assistant:

void CreateVectorizedFunction(const string &name, scalar_function_t udf_func,
	                              LogicalType varargs = LogicalType::INVALID) {
		UDFWrapper::RegisterFunction<TR, ARGS...>(name, udf_func, *context, std::move(varargs));
	}